

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HastTest.cpp
# Opt level: O2

int main(void)

{
  thread secondThread;
  thread firstThread;
  HashMap<int,_int,_std::hash<int>_> integerMap;
  reference_wrapper<CTSL::HashMap<int,_int,_std::hash<int>_>_> local_38;
  thread local_30;
  reference_wrapper<CTSL::HashMap<int,_int,_std::hash<int>_>_> local_28;
  HashMap<int,_int,_std::hash<int>_> local_20;
  
  testSingleThread();
  CTSL::HashMap<int,_int,_std::hash<int>_>::HashMap(&local_20,0x407);
  local_38._M_data = &local_20;
  std::thread::
  thread<void(&)(CTSL::HashMap<int,int,std::hash<int>>&),std::reference_wrapper<CTSL::HashMap<int,int,std::hash<int>>>,void>
            (&local_30,testMultiThreadIntegerKey_Func1,&local_38);
  local_28._M_data = &local_20;
  std::thread::
  thread<void(&)(CTSL::HashMap<int,int,std::hash<int>>&),std::reference_wrapper<CTSL::HashMap<int,int,std::hash<int>>>,void>
            ((thread *)&local_38,testMultiThreadIntegerKey_Func2,&local_28);
  std::thread::join();
  std::thread::join();
  std::thread::~thread((thread *)&local_38);
  std::thread::~thread(&local_30);
  CTSL::HashMap<int,_int,_std::hash<int>_>::~HashMap(&local_20);
  return 0;
}

Assistant:

int main()
{
  testSingleThread(); // Single threaded test

  // Multi threaded test with two threads
  CTSL::HashMap<int, int> integerMap;
  std::thread firstThread(testMultiThreadIntegerKey_Func1, ref(integerMap));
  std::thread secondThread(testMultiThreadIntegerKey_Func2, ref(integerMap));

  firstThread.join();
  secondThread.join();

  return 0;
}